

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveDefineLabel(Parser *parser,int flags,optional<bool> thumbMode)

{
  pointer pcVar1;
  bool bVar2;
  Token *token;
  Token *pTVar3;
  CAssemblerLabel *this;
  optional<bool> in_CX;
  undefined4 in_register_00000034;
  Parser *this_00;
  ValueType *symbol;
  Expression value;
  string local_88;
  Identifier local_68;
  Expression local_48;
  
  this_00 = (Parser *)CONCAT44(in_register_00000034,flags);
  token = Tokenizer::nextToken
                    ((this_00->entries).
                     super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
  if ((token->type != Identifier) ||
     (pTVar3 = Tokenizer::nextToken
                         ((this_00->entries).
                          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer),
     pTVar3->type != Comma)) {
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           parser;
  }
  Parser::parseExpression(&local_48,this_00);
  if (local_48.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    if (*(__index_type *)
         ((long)&(token->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x04') {
      __assert_fail("std::holds_alternative<Identifier>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x4d,"const Identifier &Token::identifierValue() const");
    }
    symbol = &token->value;
    bVar2 = SymbolTable::isValidSymbolName((Identifier *)symbol);
    if (bVar2) {
      pcVar1 = (token->originalText)._M_dataplus._M_p;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar1,pcVar1 + (token->originalText)._M_string_length);
      Identifier::Identifier(&local_68,&local_88);
      this = (CAssemblerLabel *)operator_new(0x48);
      CAssemblerLabel::CAssemblerLabel(this,(Identifier *)symbol,&local_68,&local_48,in_CX);
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)this;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._name._M_dataplus._M_p != &local_68._name.field_2) {
        operator_delete(local_68._name._M_dataplus._M_p,
                        local_68._name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0017efd7;
    }
    Parser::printError<Identifier>(this_00,token,"Invalid label name \"%s\"",(Identifier *)symbol);
  }
  (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_0017efd7:
  if (local_48.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           parser;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            (local_48.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveDefineLabel(Parser& parser, int flags, std::optional<bool> thumbMode)
{
	const Token& tok = parser.nextToken();
	if (tok.type != TokenType::Identifier)
		return nullptr;

	if (parser.nextToken().type != TokenType::Comma)
		return nullptr;

	Expression value = parser.parseExpression();
	if (!value.isLoaded())
		return nullptr;

	const Identifier &identifier = tok.identifierValue();
	if (!Global.symbolTable.isValidSymbolName(identifier))
	{
		parser.printError(tok, "Invalid label name \"%s\"",identifier);
		return nullptr;
	}

	return std::make_unique<CAssemblerLabel>(identifier,Identifier(tok.getOriginalText()),value,thumbMode);
}